

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

_Bool trans_STRD_rr(DisasContext_conflict1 *s,arg_ldst_rr *a)

{
  int iVar1;
  ulong uVar2;
  TCGContext_conflict1 *s_00;
  TCGContext_conflict1 *pTVar3;
  TCGv_i32 a32;
  TCGTemp *pTVar4;
  uintptr_t o;
  TCGv_i32 pTVar5;
  ARMMMUIdx index;
  uintptr_t o_1;
  
  uVar2 = s->features;
  if ((short)uVar2 < 0) {
    if ((a->rt & 1) == 0) {
      s_00 = s->uc->tcg_ctx;
      index = s->mmu_idx & 0xf;
      a32 = op_addr_rr_pre(s,a);
      iVar1 = a->rt;
      pTVar3 = s->uc->tcg_ctx;
      pTVar4 = tcg_temp_new_internal_aarch64(pTVar3,TCG_TYPE_I32,false);
      pTVar5 = (TCGv_i32)((long)pTVar4 - (long)pTVar3);
      load_reg_var(s,pTVar5,iVar1);
      gen_aa32_st_i32(s,pTVar5,a32,index,s->be_data | MO_32);
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar5 + (long)s_00));
      tcg_gen_addi_i32_aarch64(s_00,a32,a32,4);
      iVar1 = a->rt;
      pTVar3 = s->uc->tcg_ctx;
      pTVar4 = tcg_temp_new_internal_aarch64(pTVar3,TCG_TYPE_I32,false);
      pTVar5 = (TCGv_i32)((long)pTVar4 - (long)pTVar3);
      load_reg_var(s,pTVar5,iVar1 + 1);
      gen_aa32_st_i32(s,pTVar5,a32,index,s->be_data | MO_32);
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar5 + (long)s_00));
      op_addr_rr_post(s,a,a32,-4);
    }
    else {
      unallocated_encoding_aarch64(s);
    }
  }
  return SUB81((uVar2 & 0xffff) >> 0xf,0);
}

Assistant:

static bool trans_STRD_rr(DisasContext *s, arg_ldst_rr *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int mem_idx = get_mem_index(s);
    TCGv_i32 addr, tmp;

    if (!ENABLE_ARCH_5TE) {
        return false;
    }
    if (a->rt & 1) {
        unallocated_encoding(s);
        return true;
    }
    addr = op_addr_rr_pre(s, a);

    tmp = load_reg(s, a->rt);
    gen_aa32_st_i32(s, tmp, addr, mem_idx, MO_UL | s->be_data);
    tcg_temp_free_i32(tcg_ctx, tmp);

    tcg_gen_addi_i32(tcg_ctx, addr, addr, 4);

    tmp = load_reg(s, a->rt + 1);
    gen_aa32_st_i32(s, tmp, addr, mem_idx, MO_UL | s->be_data);
    tcg_temp_free_i32(tcg_ctx, tmp);

    op_addr_rr_post(s, a, addr, -4);
    return true;
}